

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O0

TimestampComponents * duckdb::Timestamp::GetComponents(timestamp_t timestamp)

{
  undefined8 in_RSI;
  date_t d;
  TimestampComponents *in_RDI;
  dtime_t *in_stack_00000020;
  date_t *in_stack_00000028;
  dtime_t time;
  date_t date;
  TimestampComponents *day;
  int32_t *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  dtime_t local_18;
  undefined4 local_c;
  
  d.days = (int32_t)((ulong)in_RSI >> 0x20);
  day = in_RDI;
  Convert((timestamp_t)time.micros,in_stack_00000028,in_stack_00000020);
  Date::Convert(d,(int32_t *)CONCAT44(local_c,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0,
                &day->year);
  Time::Convert(local_18,&in_RDI->hour,&in_RDI->minute,&in_RDI->second,&in_RDI->microsecond);
  return day;
}

Assistant:

TimestampComponents Timestamp::GetComponents(timestamp_t timestamp) {
	date_t date;
	dtime_t time;

	Convert(timestamp, date, time);

	TimestampComponents result;
	Date::Convert(date, result.year, result.month, result.day);
	Time::Convert(time, result.hour, result.minute, result.second, result.microsecond);
	return result;
}